

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O3

bool __thiscall
Lib::
FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_Kernel::LookaheadLiteralSelector::GenIteratorIterator::TermUnificationRetriever,_Lib::VirtualIterator<std::tuple<>_>_>_>
::hasNext(FlatteningIterator<Lib::MappingIterator<Lib::VirtualIterator<Kernel::Term_*>,_Kernel::LookaheadLiteralSelector::GenIteratorIterator::TermUnificationRetriever,_Lib::VirtualIterator<std::tuple<>_>_>_>
          *this)

{
  long *plVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  SortId t;
  Value unaff_RBX;
  TypedTermList trm;
  OptionBase<Lib::VirtualIterator<std::tuple<>_>_> local_48;
  Value local_38;
  undefined4 extraout_var;
  
  if ((this->_current).super_OptionBase<Lib::VirtualIterator<std::tuple<>_>_>._isSome == true) {
    do {
      cVar2 = (**(code **)(*(long *)(this->_current).
                                    super_OptionBase<Lib::VirtualIterator<std::tuple<>_>_>._elem.
                                    _elem + 0x10))();
      if (cVar2 != '\0') {
        return (bool)cVar2;
      }
      iVar3 = (*((this->_master)._inner._core)->_vptr_IteratorCore[2])();
      if ((char)iVar3 == '\0') {
        local_48._isSome = false;
        local_48._1_7_ = 0;
        local_48._elem._elem = (Value)0x0;
      }
      else {
        t._content._0_4_ = (*((this->_master)._inner._core)->_vptr_IteratorCore[3])();
        t._content._4_4_ = extraout_var;
        Kernel::SortHelper::getResultSort((Term *)t._content);
        trm._sort._content = t._content;
        trm.super_TermList._content = (uint64_t)this;
        Kernel::LookaheadLiteralSelector::GenIteratorIterator::TermUnificationRetriever::operator()
                  ((TermUnificationRetriever *)&local_38.init,trm);
        unaff_RBX = local_38;
        if (local_38 == (Value)0x0) {
          local_48._isSome = true;
          local_48._elem._elem = (Value)0x0;
          unaff_RBX = (Value)0x0;
        }
        else {
          local_48._isSome = true;
          local_48._elem._elem = local_38;
          iVar4 = *(int *)((long)local_38 + 8) + 2;
          *(int *)((long)local_38 + 8) = iVar4;
          if (iVar4 == 0) {
            (**(code **)(*(long *)local_38 + 8))(local_38);
          }
        }
      }
      OptionBase<Lib::VirtualIterator<std::tuple<>_>_>::operator=
                (&(this->_current).super_OptionBase<Lib::VirtualIterator<std::tuple<>_>_>,&local_48)
      ;
      if ((local_48._isSome == true) && (local_48._elem._elem != (Value)0x0)) {
        plVar1 = (long *)((long)local_48._elem._elem + 8);
        *(int *)plVar1 = *(int *)plVar1 + -1;
        if (*(int *)plVar1 == 0) {
          (**(code **)(*(long *)local_48._elem._elem + 8))();
        }
      }
      if ((char)iVar3 != '\0') {
        if (unaff_RBX != (Value)0x0) {
          plVar1 = (long *)((long)unaff_RBX + 8);
          *(int *)plVar1 = *(int *)plVar1 + -1;
          if (*(int *)plVar1 == 0) {
            (**(code **)(*(long *)unaff_RBX + 8))(unaff_RBX);
          }
        }
        if (local_38 != (Value)0x0) {
          plVar1 = (long *)((long)local_38 + 8);
          *(int *)plVar1 = *(int *)plVar1 + -1;
          if (*(int *)plVar1 == 0) {
            (**(code **)(*(long *)local_38 + 8))();
          }
        }
      }
    } while ((this->_current).super_OptionBase<Lib::VirtualIterator<std::tuple<>_>_>._isSome !=
             false);
  }
  return false;
}

Assistant:

bool hasNext()
  {
    while (_current.isSome()) {
      if (_current->hasNext()) {
        return true;
      } else {
        _current = _master.hasNext() 
          ? Option<Inner>(move_if_value<Inner>(_master.next())) 
          : Option<Inner>();
      }
    }
    return false;
  }